

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coin.cpp
# Opt level: O0

void node::FindCoins(NodeContext *node,
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *coins)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  Chainstate *this;
  CCoinsViewCache *baseIn;
  type mempoolIn;
  Coin *in_RSI;
  long in_FS_OFFSET;
  pair<const_COutPoint,_Coin> *coin;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *__range1;
  CCoinsViewCache *chain_view;
  iterator __end1;
  iterator __begin1;
  CCoinsViewMemPool mempool_view;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CCoinsViewMemPool *in_stack_fffffffffffffea8;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  Chainstate *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffee0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffee8;
  CCoinsViewCache *outpoint;
  CCoinsViewMemPool *in_stack_ffffffffffffff00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                     in_stack_fffffffffffffea8);
  if (!bVar2) {
    __assert_fail("node.mempool",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/coin.cpp"
                  ,0xe,"void node::FindCoins(const NodeContext &, std::map<COutPoint, Coin> &)");
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                     in_stack_fffffffffffffea8);
  if (!bVar2) {
    __assert_fail("node.chainman",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/coin.cpp"
                  ,0xf,"void node::FindCoins(const NodeContext &, std::map<COutPoint, Coin> &)");
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffffea8);
  mutexIn = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffee8,mutexIn,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffea8);
  this = ChainstateManager::ActiveChainstate
                   ((ChainstateManager *)
                    CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  baseIn = Chainstate::CoinsTip(in_stack_fffffffffffffec8);
  outpoint = baseIn;
  mempoolIn = std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
                        ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                         CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  CCoinsViewMemPool::CCoinsViewMemPool((CCoinsViewMemPool *)this,(CCoinsView *)baseIn,mempoolIn);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  begin(in_stack_fffffffffffffeb0);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  end(in_stack_fffffffffffffeb0);
  while( true ) {
    bVar2 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                            (_Self *)in_stack_fffffffffffffeb0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffebf =
         CCoinsViewMemPool::GetCoin(in_stack_ffffffffffffff00,(COutPoint *)outpoint,in_RSI);
    if (!(bool)in_stack_fffffffffffffebf) {
      Coin::Clear((Coin *)in_stack_fffffffffffffea8);
    }
    std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)in_stack_fffffffffffffea8);
  }
  CCoinsViewMemPool::~CCoinsViewMemPool(in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FindCoins(const NodeContext& node, std::map<COutPoint, Coin>& coins)
{
    assert(node.mempool);
    assert(node.chainman);
    LOCK2(cs_main, node.mempool->cs);
    CCoinsViewCache& chain_view = node.chainman->ActiveChainstate().CoinsTip();
    CCoinsViewMemPool mempool_view(&chain_view, *node.mempool);
    for (auto& coin : coins) {
        if (!mempool_view.GetCoin(coin.first, coin.second)) {
            // Either the coin is not in the CCoinsViewCache or is spent. Clear it.
            coin.second.Clear();
        }
    }
}